

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O3

void __thiscall
Imf_2_5::FastHufDecoder::decode
          (FastHufDecoder *this,uchar *src,int numSrcBits,unsigned_short *dst,int numDstElems)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  InputExc *this_00;
  byte bVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong *puVar24;
  char *text;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  int *piVar29;
  long lVar30;
  ulong *puVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 in_XMM0 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar54;
  int iVar57;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar43;
  
  auVar19 = _DAT_02dca810;
  auVar18 = _DAT_02dca7f0;
  auVar17 = _DAT_02dca7e0;
  auVar16 = _DAT_00517f60;
  if (numSrcBits < 0x80) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    text = "Error choosing Huffman decoder implementation (insufficient number of bits).";
  }
  else {
    iVar21 = numSrcBits + -0x80;
    if (0 < numDstElems) {
      uVar4 = *(ulong *)(src + 8);
      uVar23 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      uVar4 = *(ulong *)src;
      uVar34 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      puVar24 = (ulong *)(src + 0x10);
      uVar4 = this->_tableMin;
      iVar2 = this->_numSymbols;
      piVar5 = this->_idToSymbol;
      iVar3 = this->_rleSymbol;
      uVar33 = 0;
      uVar25 = 0x40;
      iVar32 = 0x40;
      do {
        if (uVar34 < uVar4) {
          if (uVar25 < 0x40) {
            iVar26 = 0x40 - uVar25;
            uVar34 = uVar23 >> ((byte)uVar25 & 0x3f) | uVar34;
            iVar54 = iVar32;
            iVar40 = iVar32 - iVar26;
            if (iVar32 < iVar26) {
              if (iVar21 < 0x40) {
                iVar22 = 0;
                if (iVar21 < 1) {
                  uVar23 = 0;
                }
                else {
                  uVar25 = iVar21 + 8;
                  bVar20 = 0x38;
                  uVar23 = 0;
                  puVar31 = puVar24;
                  do {
                    uVar23 = uVar23 | (ulong)(byte)*puVar31 << (bVar20 & 0x3f);
                    puVar31 = (ulong *)((long)puVar31 + 1);
                    bVar20 = bVar20 - 8;
                    uVar25 = uVar25 - 8;
                  } while (8 < uVar25);
                  puVar24 = (ulong *)((long)puVar24 + (ulong)(iVar21 - 1U >> 3) + 1);
                }
              }
              else {
                uVar23 = *puVar24;
                uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                         (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                         (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                         (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
                puVar24 = puVar24 + 1;
                iVar22 = iVar21 + -0x40;
              }
              iVar26 = iVar26 - iVar32;
              iVar54 = 0x40;
              uVar34 = uVar34 | uVar23 >> (-(char)iVar26 & 0x3fU);
              iVar40 = 0x40 - iVar26;
              iVar21 = iVar22;
            }
            iVar32 = iVar40;
            uVar23 = uVar23 << ((byte)iVar26 & 0x3f);
            if (iVar54 == iVar26) {
              uVar23 = 0;
            }
            uVar25 = 0x40;
          }
          lVar30 = -0x34;
          do {
            lVar43 = lVar30;
            if (this->_ljOffset[lVar43 + 6] <= uVar34) break;
            lVar30 = lVar43 + 1;
          } while (lVar43 + 0x41U <= (ulong)this->_maxCodeLength);
          if (lVar43 + 0x41U <= (ulong)this->_maxCodeLength) {
            uVar28 = (uVar34 >> (-(char)(lVar43 + 1) & 0x3fU)) +
                     *(long *)(this->_tableSymbol + lVar43 * 2 + 0xc);
            if (uVar28 < (ulong)(long)iVar2) {
              uVar27 = (int)lVar43 + 0x41;
              piVar29 = piVar5 + uVar28;
              goto LAB_004d3337;
            }
          }
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          text = "Huffman decode error (Decoded an invalid symbol).";
          goto LAB_004d381c;
        }
        uVar27 = (uint)this->_tableCodeLen[uVar34 >> 0x34];
        piVar29 = this->_tableSymbol + (uVar34 >> 0x34);
LAB_004d3337:
        uVar34 = uVar34 << ((byte)uVar27 & 0x3f);
        uVar25 = uVar25 - uVar27;
        if (*piVar29 == iVar3) {
          if ((int)uVar25 < 8) {
            iVar22 = 0x40 - uVar25;
            uVar34 = uVar23 >> ((byte)uVar25 & 0x3f) | uVar34;
            iVar54 = iVar32;
            iVar40 = iVar32 - iVar22;
            iVar26 = iVar21;
            if (iVar32 < iVar22) {
              if (iVar21 < 0x40) {
                iVar26 = 0;
                if (iVar21 < 1) {
                  uVar23 = 0;
                }
                else {
                  uVar25 = iVar21 + 8;
                  bVar20 = 0x38;
                  uVar23 = 0;
                  puVar31 = puVar24;
                  do {
                    uVar23 = uVar23 | (ulong)(byte)*puVar31 << (bVar20 & 0x3f);
                    puVar31 = (ulong *)((long)puVar31 + 1);
                    bVar20 = bVar20 - 8;
                    uVar25 = uVar25 - 8;
                  } while (8 < uVar25);
                  puVar24 = (ulong *)((long)puVar24 + (ulong)(iVar21 - 1U >> 3) + 1);
                }
              }
              else {
                uVar23 = *puVar24;
                uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                         (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                         (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                         (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
                puVar24 = puVar24 + 1;
                iVar26 = iVar21 + -0x40;
              }
              iVar22 = iVar22 - iVar32;
              iVar54 = 0x40;
              uVar34 = uVar34 | uVar23 >> (-(char)iVar22 & 0x3fU);
              iVar40 = 0x40 - iVar22;
            }
            iVar32 = iVar40;
            uVar23 = uVar23 << ((byte)iVar22 & 0x3f);
            if (iVar54 == iVar22) {
              uVar23 = 0;
            }
            uVar25 = 0x40;
            iVar21 = iVar26;
          }
          if ((int)uVar33 < 1) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            text = "Huffman decode error (RLE code with no previous symbol).";
            goto LAB_004d381c;
          }
          bVar20 = (byte)(uVar34 >> 0x38);
          uVar27 = uVar33 + bVar20;
          if (numDstElems < (int)uVar27) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            text = "Huffman decode error (Symbol run beyond expected output buffer length).";
            goto LAB_004d381c;
          }
          if (uVar34 >> 0x38 == 0) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            text = "Huffman decode error (Invalid RLE length)";
            goto LAB_004d381c;
          }
          uVar1 = dst[(ulong)uVar33 - 1];
          lVar30 = (uVar34 >> 0x38) - 1;
          auVar41._8_4_ = (int)lVar30;
          auVar41._0_8_ = lVar30;
          auVar41._12_4_ = (int)((ulong)lVar30 >> 0x20);
          lVar30 = (ulong)uVar33 * 2;
          auVar41 = auVar41 ^ auVar19;
          uVar28 = 0;
          auVar42 = auVar16;
          auVar44 = auVar18;
          auVar45 = auVar17;
          auVar46 = _DAT_02dca7d0;
          do {
            auVar47 = auVar42 ^ auVar19;
            iVar54 = auVar41._0_4_;
            iVar53 = -(uint)(iVar54 < auVar47._0_4_);
            iVar40 = auVar41._4_4_;
            auVar48._4_4_ = -(uint)(iVar40 < auVar47._4_4_);
            iVar26 = auVar41._8_4_;
            iVar57 = -(uint)(iVar26 < auVar47._8_4_);
            iVar22 = auVar41._12_4_;
            auVar48._12_4_ = -(uint)(iVar22 < auVar47._12_4_);
            auVar35._4_4_ = iVar53;
            auVar35._0_4_ = iVar53;
            auVar35._8_4_ = iVar57;
            auVar35._12_4_ = iVar57;
            auVar58 = pshuflw(in_XMM15,auVar35,0xe8);
            auVar36._4_4_ = -(uint)(auVar47._4_4_ == iVar40);
            auVar36._12_4_ = -(uint)(auVar47._12_4_ == iVar22);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar35 = pshuflw(in_XMM0,auVar36,0xe8);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar59 = pshuflw(auVar58,auVar48,0xe8);
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            auVar47 = (auVar59 | auVar35 & auVar58) ^ auVar47;
            auVar47 = packssdw(auVar47,auVar47);
            if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30) = uVar1;
            }
            auVar59._4_4_ = iVar53;
            auVar59._0_4_ = iVar53;
            auVar59._8_4_ = iVar57;
            auVar59._12_4_ = iVar57;
            auVar48 = auVar36 & auVar59 | auVar48;
            auVar35 = packssdw(auVar48,auVar48);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar58,auVar35 ^ auVar58);
            if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 2) = uVar1;
            }
            auVar35 = auVar44 ^ auVar19;
            iVar53 = -(uint)(iVar54 < auVar35._0_4_);
            auVar55._4_4_ = -(uint)(iVar40 < auVar35._4_4_);
            iVar57 = -(uint)(iVar26 < auVar35._8_4_);
            auVar55._12_4_ = -(uint)(iVar22 < auVar35._12_4_);
            auVar49._4_4_ = iVar53;
            auVar49._0_4_ = iVar53;
            auVar49._8_4_ = iVar57;
            auVar49._12_4_ = iVar57;
            iVar53 = -(uint)(auVar35._4_4_ == iVar40);
            iVar57 = -(uint)(auVar35._12_4_ == iVar22);
            auVar10._4_4_ = iVar53;
            auVar10._0_4_ = iVar53;
            auVar10._8_4_ = iVar57;
            auVar10._12_4_ = iVar57;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar35 = auVar10 & auVar49 | auVar55;
            auVar35 = packssdw(auVar35,auVar35);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar6,auVar35 ^ auVar6);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 4) = uVar1;
            }
            auVar35 = pshufhw(auVar35,auVar49,0x84);
            auVar11._4_4_ = iVar53;
            auVar11._0_4_ = iVar53;
            auVar11._8_4_ = iVar57;
            auVar11._12_4_ = iVar57;
            auVar48 = pshufhw(auVar49,auVar11,0x84);
            auVar36 = pshufhw(auVar35,auVar55,0x84);
            auVar37._8_4_ = 0xffffffff;
            auVar37._0_8_ = 0xffffffffffffffff;
            auVar37._12_4_ = 0xffffffff;
            auVar37 = (auVar36 | auVar48 & auVar35) ^ auVar37;
            auVar35 = packssdw(auVar37,auVar37);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 6) = uVar1;
            }
            auVar35 = auVar45 ^ auVar19;
            iVar53 = -(uint)(iVar54 < auVar35._0_4_);
            auVar51._4_4_ = -(uint)(iVar40 < auVar35._4_4_);
            iVar57 = -(uint)(iVar26 < auVar35._8_4_);
            auVar51._12_4_ = -(uint)(iVar22 < auVar35._12_4_);
            auVar12._4_4_ = iVar53;
            auVar12._0_4_ = iVar53;
            auVar12._8_4_ = iVar57;
            auVar12._12_4_ = iVar57;
            auVar36 = pshuflw(auVar47,auVar12,0xe8);
            auVar38._0_4_ = -(uint)(auVar35._0_4_ == iVar54);
            auVar38._4_4_ = -(uint)(auVar35._4_4_ == iVar40);
            auVar38._8_4_ = -(uint)(auVar35._8_4_ == iVar26);
            auVar38._12_4_ = -(uint)(auVar35._12_4_ == iVar22);
            auVar50._4_4_ = auVar38._4_4_;
            auVar50._0_4_ = auVar38._4_4_;
            auVar50._8_4_ = auVar38._12_4_;
            auVar50._12_4_ = auVar38._12_4_;
            auVar47 = pshuflw(auVar38,auVar50,0xe8);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar35 = pshuflw(auVar36,auVar51,0xe8);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            in_XMM15 = (auVar35 | auVar47 & auVar36) ^ auVar7;
            auVar47 = packssdw(auVar47 & auVar36,in_XMM15);
            if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 8) = uVar1;
            }
            auVar13._4_4_ = iVar53;
            auVar13._0_4_ = iVar53;
            auVar13._8_4_ = iVar57;
            auVar13._12_4_ = iVar57;
            auVar51 = auVar50 & auVar13 | auVar51;
            auVar35 = packssdw(auVar51,auVar51);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar47 = packssdw(auVar47,auVar35 ^ auVar8);
            if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 10) = uVar1;
            }
            auVar47 = auVar46 ^ auVar19;
            iVar54 = -(uint)(iVar54 < auVar47._0_4_);
            auVar56._4_4_ = -(uint)(iVar40 < auVar47._4_4_);
            iVar26 = -(uint)(iVar26 < auVar47._8_4_);
            auVar56._12_4_ = -(uint)(iVar22 < auVar47._12_4_);
            auVar52._4_4_ = iVar54;
            auVar52._0_4_ = iVar54;
            auVar52._8_4_ = iVar26;
            auVar52._12_4_ = iVar26;
            iVar54 = -(uint)(auVar47._4_4_ == iVar40);
            iVar40 = -(uint)(auVar47._12_4_ == iVar22);
            auVar14._4_4_ = iVar54;
            auVar14._0_4_ = iVar54;
            auVar14._8_4_ = iVar40;
            auVar14._12_4_ = iVar40;
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar47 = auVar14 & auVar52 | auVar56;
            auVar47 = packssdw(auVar47,auVar47);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar47 = packssdw(auVar47 ^ auVar9,auVar47 ^ auVar9);
            if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 0xc) = uVar1;
            }
            auVar47 = pshufhw(auVar47,auVar52,0x84);
            auVar15._4_4_ = iVar54;
            auVar15._0_4_ = iVar54;
            auVar15._8_4_ = iVar40;
            auVar15._12_4_ = iVar40;
            auVar36 = pshufhw(auVar52,auVar15,0x84);
            auVar35 = pshufhw(auVar47,auVar56,0x84);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar39 = (auVar35 | auVar36 & auVar47) ^ auVar39;
            in_XMM0 = packssdw(auVar39,auVar39);
            if ((in_XMM0 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar28 + lVar30 + 0xe) = uVar1;
            }
            lVar43 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 8;
            auVar42._8_8_ = lVar43 + 8;
            lVar43 = auVar44._8_8_;
            auVar44._0_8_ = auVar44._0_8_ + 8;
            auVar44._8_8_ = lVar43 + 8;
            lVar43 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 8;
            auVar45._8_8_ = lVar43 + 8;
            lVar43 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 8;
            auVar46._8_8_ = lVar43 + 8;
            uVar28 = uVar28 + 0x10;
          } while (((uint)bVar20 * 2 + 0xe & 0xfffffff0) != uVar28);
          uVar34 = uVar34 << 8;
          uVar25 = uVar25 - 8;
          uVar33 = uVar27;
        }
        else {
          dst[(int)uVar33] = (unsigned_short)*piVar29;
          uVar33 = uVar33 + 1;
        }
        if ((int)uVar25 < 0xc) {
          iVar54 = 0x40 - uVar25;
          uVar34 = uVar23 >> ((byte)uVar25 & 0x3f) | uVar34;
          iVar40 = iVar32 - iVar54;
          if (iVar32 < iVar54) {
            if (iVar21 < 0x40) {
              iVar26 = 0;
              if (iVar21 < 1) {
                uVar23 = 0;
              }
              else {
                uVar25 = iVar21 + 8;
                bVar20 = 0x38;
                uVar23 = 0;
                puVar31 = puVar24;
                do {
                  uVar23 = uVar23 | (ulong)(byte)*puVar31 << (bVar20 & 0x3f);
                  puVar31 = (ulong *)((long)puVar31 + 1);
                  bVar20 = bVar20 - 8;
                  uVar25 = uVar25 - 8;
                } while (8 < uVar25);
                puVar24 = (ulong *)((long)puVar24 + (ulong)(iVar21 - 1U >> 3) + 1);
              }
            }
            else {
              uVar23 = *puVar24;
              uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                       (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                       (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                       (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
              puVar24 = puVar24 + 1;
              iVar26 = iVar21 + -0x40;
            }
            iVar54 = iVar54 - iVar32;
            iVar32 = 0x40;
            iVar40 = 0x40 - iVar54;
            uVar34 = uVar34 | uVar23 >> (-(char)iVar54 & 0x3fU);
            iVar21 = iVar26;
          }
          uVar23 = uVar23 << ((byte)iVar54 & 0x3f);
          if (iVar32 == iVar54) {
            uVar23 = 0;
          }
          uVar25 = 0x40;
          iVar32 = iVar40;
        }
      } while ((int)uVar33 < numDstElems);
    }
    if (iVar21 == 0) {
      return;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    text = "Huffman decode error (Compressed data remains after filling expected output buffer).";
  }
LAB_004d381c:
  Iex_2_5::InputExc::InputExc(this_00,text);
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
FastHufDecoder::decode
    (const unsigned char *src,
     int numSrcBits,
     unsigned short *dst, 
     int numDstElems)
{
    if (numSrcBits < 128)
        throw IEX_NAMESPACE::InputExc ("Error choosing Huffman decoder implementation "
                                       "(insufficient number of bits).");

    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char *currByte = src + 2 * sizeof (Int64);

    numSrcBits -= 8 * 2 * sizeof (Int64);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    Int64 buffer            = READ64 (src); 
    int   bufferNumBits     = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    Int64 bufferBack        = READ64 ((src + sizeof (Int64))); 
    int   bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int  codeLen;
        int  symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (_tableMin <= buffer)
        {
            int tableIdx = buffer >> (64 - TABLE_LOOKUP_BITS);

            // 
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = _tableCodeLen[tableIdx];
            symbol  = _tableSymbol[tableIdx];
        }
        else
        {
            if (bufferNumBits < 64)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            // 
            // Brute force search: 
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            while (_ljBase[codeLen] > buffer && codeLen <= _maxCodeLength)
                codeLen++;

            if (codeLen > _maxCodeLength)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }

            Int64 id = _ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < static_cast<Int64>(_numSymbols))
            {
                symbol = _idToSymbol[id];
            }
            else
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we recieved a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == _rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (RLE code "
                                               "with no previous symbol).");
            }

            if (dstIdx + rleCount > numDstElems)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (Symbol run "
                                               "beyond expected output buffer length).");
            }

            if (rleCount <= 0) 
            {
                throw IEX_NAMESPACE::InputExc("Huffman decode error"
                                              " (Invalid RLE length)");
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of 
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            refill (buffer,
                    64 - bufferNumBits,
                    bufferBack,
                    bufferBackNumBits,
                    currByte,
                    numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        throw IEX_NAMESPACE::InputExc ("Huffman decode error (Compressed data remains "
                                       "after filling expected output buffer).");
    }
}